

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void absl::lts_20240722::base_internal::Coalesce(AllocList *a)

{
  AllocList *e;
  Arena *pAVar1;
  int iVar2;
  AllocList *local_118;
  AllocList *prev [30];
  Arena *arena;
  AllocList *n;
  AllocList *a_local;
  
  e = a->next[0];
  if ((e != (AllocList *)0x0) && ((AllocList *)((long)a->next + ((a->header).size - 0x28)) == e)) {
    pAVar1 = (a->header).arena;
    (a->header).size = (e->header).size + (a->header).size;
    (e->header).magic = 0;
    (e->header).arena = (Arena *)0x0;
    LLA_SkiplistDelete(&pAVar1->freelist,e,&local_118);
    LLA_SkiplistDelete(&pAVar1->freelist,a,&local_118);
    iVar2 = LLA_SkiplistLevels((a->header).size,pAVar1->min_size,&pAVar1->random);
    a->levels = iVar2;
    LLA_SkiplistInsert(&pAVar1->freelist,a,&local_118);
  }
  return;
}

Assistant:

static void Coalesce(AllocList *a) {
  AllocList *n = a->next[0];
  if (n != nullptr && reinterpret_cast<char *>(a) + a->header.size ==
                          reinterpret_cast<char *>(n)) {
    LowLevelAlloc::Arena *arena = a->header.arena;
    a->header.size += n->header.size;
    n->header.magic = 0;
    n->header.arena = nullptr;
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, n, prev);
    LLA_SkiplistDelete(&arena->freelist, a, prev);
    a->levels =
        LLA_SkiplistLevels(a->header.size, arena->min_size, &arena->random);
    LLA_SkiplistInsert(&arena->freelist, a, prev);
  }
}